

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

char * __thiscall nuraft::buffer::get_str(buffer *this)

{
  size_t sVar1;
  size_t sVar2;
  buffer *in_RDI;
  bool bVar3;
  byte *d;
  size_t i;
  size_t s;
  size_t p;
  long local_28;
  byte *local_8;
  
  sVar1 = pos(in_RDI);
  sVar2 = size(in_RDI);
  local_28 = 0;
  local_8 = data(in_RDI);
  while( true ) {
    bVar3 = false;
    if (sVar1 + local_28 < sVar2) {
      bVar3 = local_8[local_28] != '\0';
    }
    if (!bVar3) break;
    local_28 = local_28 + 1;
  }
  if (local_28 == 0) {
    if ((*(uint *)in_RDI & 0x80000000) == 0) {
      *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)local_28 + 1;
    }
    else {
      *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + (int)local_28 + 1;
    }
  }
  if ((sVar1 + local_28 < sVar2) && (local_28 != 0)) {
    if ((*(uint *)in_RDI & 0x80000000) == 0) {
      *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)local_28 + 1;
    }
    else {
      *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + (int)local_28 + 1;
    }
  }
  else {
    local_8 = (byte *)0x0;
  }
  return (char *)local_8;
}

Assistant:

const char* buffer::get_str() {
    size_t p = pos();
    size_t s = size();
    size_t i = 0;
    byte* d = data();
    while ( (p + i) < s && *(d + i) ) ++i;
    if (i == 0) {
        // Empty string, move forward 1 byte for NULL character.
        __mv_fw_block(this, i + 1);
    }
    if (p + i >= s || i == 0) {
        return nilptr;
    }

    __mv_fw_block(this, i + 1);
    return reinterpret_cast<const char*>(d);
}